

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_> *node)

{
  pointer pRVar1;
  unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_> *in_RDX;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_50;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_48 [3];
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_30;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_28 [2];
  unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_> *node_local;
  Transformer *this_local;
  
  node_local = node;
  this_local = this;
  pRVar1 = std::unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_30,&pRVar1->num);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Replicate_*,_std::default_delete<verilogAST::Replicate>_>
              .super__Head_base<0UL,_verilogAST::Replicate_*,_false>._M_head_impl)->super_Expression
            ).super_Node)(local_28,node,&local_30);
  pRVar1 = std::unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pRVar1->num,local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_30);
  pRVar1 = std::unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_50,&pRVar1->value);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Replicate_*,_std::default_delete<verilogAST::Replicate>_>
              .super__Head_base<0UL,_verilogAST::Replicate_*,_false>._M_head_impl)->super_Expression
            ).super_Node)(local_48,node,&local_50);
  pRVar1 = std::unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pRVar1->value,local_48);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_48);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_50);
  std::unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_>::unique_ptr
            ((unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_> *)this,
             in_RDX);
  return (__uniq_ptr_data<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>,_true,_true>
          )(__uniq_ptr_data<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Replicate> Transformer::visit(std::unique_ptr<Replicate> node) {
  node->num = this->visit(std::move(node->num));
  node->value = this->visit(std::move(node->value));
  return node;
}